

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obudec.c
# Opt level: O2

int obudec_read_obu_header_and_size
              (AvxInputContext *input_ctx,size_t buffer_capacity,int is_annexb,uint8_t *buffer,
              size_t *bytes_read,size_t *payload_length,ObuHeader *obu_header,_Bool buffered)

{
  _Bool _Var1;
  aom_codec_err_t aVar2;
  size_t sVar3;
  int iVar4;
  ulong buffer_length;
  char *__ptr;
  byte *buf;
  undefined1 auVar5 [16];
  size_t sStack_70;
  size_t leb128_length_obu;
  uint64_t obu_size;
  uint64_t u64_payload_length;
  size_t *local_40;
  size_t leb128_length_payload;
  
  auVar5._0_4_ = -(uint)(buffer == (uint8_t *)0x0);
  auVar5._4_4_ = -(uint)(bytes_read == (size_t *)0x0);
  auVar5._8_4_ = -(uint)(payload_length == (size_t *)0x0);
  auVar5._12_4_ = -(uint)(obu_header == (ObuHeader *)0x0);
  iVar4 = movmskps((int)buffer,auVar5);
  if (iVar4 != 0 || buffer_capacity < 0x12) {
    return -1;
  }
  leb128_length_obu = 0;
  leb128_length_payload = 0;
  obu_size = 0;
  local_40 = bytes_read;
  if (is_annexb == 0) {
LAB_00128527:
    if (buffer_capacity - leb128_length_obu < 2) {
      return -1;
    }
    buf = buffer + leb128_length_obu;
    sVar3 = buffer_input(input_ctx,1,buf,buffered);
    _Var1 = input_eof(input_ctx);
    if ((_Var1) && (sVar3 == 0)) {
LAB_00128564:
      *payload_length = 0;
      return 0;
    }
    if (sVar3 != 1) {
      __ptr = "obudec: Failure reading OBU header.\n";
      sStack_70 = 0x24;
      goto LAB_001286da;
    }
    buffer_length = 1;
    if ((*buf & 4) == 0) {
LAB_001285a0:
      u64_payload_length = 0;
      aVar2 = aom_read_obu_header(buf,buffer_length,&u64_payload_length,obu_header,is_annexb);
      if ((aVar2 != AOM_CODEC_OK) || (buffer_length != u64_payload_length)) {
        __ptr = "obudec: Error parsing OBU header.\n";
        sStack_70 = 0x22;
        goto LAB_001286da;
      }
      if (obu_header->has_size_field == 0) {
        if (buffer_length <= obu_size) {
          *payload_length = obu_size - buffer_length;
          leb128_length_payload = 0;
LAB_00128641:
          *local_40 = buffer_length + leb128_length_obu + leb128_length_payload;
          return 0;
        }
        __ptr = "obudec: OBU size is too small.\n";
        sStack_70 = 0x1f;
        goto LAB_001286da;
      }
      u64_payload_length = 0;
      iVar4 = obudec_read_leb128(input_ctx,buffer + buffer_length + leb128_length_obu,
                                 &leb128_length_payload,&u64_payload_length,buffered);
      if (iVar4 != 0) {
        __ptr = "obudec: Failure reading OBU payload length.\n";
        sStack_70 = 0x2c;
        goto LAB_001286da;
      }
      if (u64_payload_length >> 0x20 == 0) {
        *payload_length = u64_payload_length;
        goto LAB_00128641;
      }
      goto LAB_0012850c;
    }
    sVar3 = buffer_input(input_ctx,1,buf + 1,buffered);
    if (sVar3 == 1) {
      buffer_length = 2;
      goto LAB_001285a0;
    }
    __ptr = "obudec: Failure reading OBU extension.";
  }
  else {
    iVar4 = obudec_read_leb128(input_ctx,buffer,&leb128_length_obu,&obu_size,buffered);
    if (iVar4 != 0) {
      __ptr = "obudec: Failure reading OBU size length.\n";
      sStack_70 = 0x29;
      goto LAB_001286da;
    }
    if (leb128_length_obu == 0) goto LAB_00128564;
    if (obu_size._4_4_ == 0) goto LAB_00128527;
LAB_0012850c:
    __ptr = "obudec: OBU payload length too large.\n";
  }
  sStack_70 = 0x26;
LAB_001286da:
  fwrite(__ptr,sStack_70,1,_stderr);
  return -1;
}

Assistant:

static int obudec_read_obu_header_and_size(
    struct AvxInputContext *input_ctx, size_t buffer_capacity, int is_annexb,
    uint8_t *buffer, size_t *bytes_read, size_t *payload_length,
    ObuHeader *obu_header, bool buffered) {
  const size_t kMinimumBufferSize = OBU_MAX_HEADER_SIZE;
  if (!input_ctx || !buffer || !bytes_read || !payload_length || !obu_header ||
      buffer_capacity < kMinimumBufferSize) {
    return -1;
  }

  size_t leb128_length_obu = 0;
  size_t leb128_length_payload = 0;
  uint64_t obu_size = 0;
  if (is_annexb) {
    if (obudec_read_leb128(input_ctx, &buffer[0], &leb128_length_obu, &obu_size,
                           buffered) != 0) {
      fprintf(stderr, "obudec: Failure reading OBU size length.\n");
      return -1;
    } else if (leb128_length_obu == 0) {
      *payload_length = 0;
      return 0;
    }
    if (obu_size > UINT32_MAX) {
      fprintf(stderr, "obudec: OBU payload length too large.\n");
      return -1;
    }
  }

  size_t header_size = 0;
  if (obudec_read_obu_header(input_ctx, buffer_capacity - leb128_length_obu,
                             is_annexb, buffer + leb128_length_obu, obu_header,
                             &header_size, buffered) != 0) {
    return -1;
  } else if (header_size == 0) {
    *payload_length = 0;
    return 0;
  }

  if (!obu_header->has_size_field) {
    assert(is_annexb);
    if (obu_size < header_size) {
      fprintf(stderr, "obudec: OBU size is too small.\n");
      return -1;
    }
    *payload_length = (size_t)obu_size - header_size;
  } else {
    uint64_t u64_payload_length = 0;
    if (obudec_read_leb128(input_ctx, &buffer[leb128_length_obu + header_size],
                           &leb128_length_payload, &u64_payload_length,
                           buffered) != 0) {
      fprintf(stderr, "obudec: Failure reading OBU payload length.\n");
      return -1;
    }
    if (u64_payload_length > UINT32_MAX) {
      fprintf(stderr, "obudec: OBU payload length too large.\n");
      return -1;
    }

    *payload_length = (size_t)u64_payload_length;
  }

  *bytes_read = leb128_length_obu + header_size + leb128_length_payload;
  return 0;
}